

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QCborArray *value)

{
  Code CVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QByteArray buffer;
  QCborParserError parseError;
  QCborArray *in_stack_ffffffffffffff68;
  QCborValue *in_stack_ffffffffffffff70;
  QByteArray *in_stack_ffffffffffffff90;
  QDataStream *in_stack_ffffffffffffff98;
  QCborParserError *in_stack_ffffffffffffffb0;
  QByteArray *ba;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ba = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x476690);
  operator>>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uStack_10 = 0xaaaaaaaa00000000;
  QCborValue::fromCbor(ba,in_stack_ffffffffffffffb0);
  QCborValue::toArray((QCborValue *)in_stack_ffffffffffffff98);
  QCborArray::operator=((QCborArray *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  QCborArray::~QCborArray((QCborArray *)0x47670f);
  QCborValue::~QCborValue(in_stack_ffffffffffffff70);
  CVar1 = QCborError::operator_cast_to_Code((QCborError *)&uStack_10);
  if (CVar1 != NoError) {
    QDataStream::setStatus(in_RDI,ReadCorruptData);
  }
  QByteArray::~QByteArray((QByteArray *)0x47678e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QCborArray &value)
{
    QByteArray buffer;
    stream >> buffer;
    QCborParserError parseError{};
    value = QCborValue::fromCbor(buffer, &parseError).toArray();
    if (parseError.error)
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}